

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_hermite(HairSetNode *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *pVVar4;
  pointer pHVar5;
  undefined8 uVar6;
  long lVar7;
  Vec3fx *pVVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  pt;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::resize(&this->tangents,
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    uVar10 = 0;
    while( true ) {
      pvVar3 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 5) <= uVar10)
      break;
      bezier_to_hermite_helper(&pt,&this->hairs,pvVar3 + uVar10);
      sVar13 = pt.first.size_active;
      pvVar3 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = pvVar3[uVar10].size_alloced;
      uVar12 = uVar9;
      if ((uVar9 < pt.first.size_active) &&
         (uVar11 = uVar9, uVar12 = pt.first.size_active, uVar9 != 0)) {
        for (; uVar12 = uVar11, uVar11 < pt.first.size_active;
            uVar11 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0)) {
        }
      }
      if (pt.first.size_active < pvVar3[uVar10].size_active) {
        pvVar3[uVar10].size_active = pt.first.size_active;
      }
      if (uVar9 == uVar12) {
        pvVar3[uVar10].size_active = pt.first.size_active;
      }
      else {
        pVVar4 = pvVar3[uVar10].items;
        pVVar8 = (Vec3fx *)alignedMalloc(uVar12 << 4,0x10);
        pvVar3[uVar10].items = pVVar8;
        lVar7 = 0;
        for (uVar9 = 0; uVar9 < pvVar3[uVar10].size_active; uVar9 = uVar9 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
          uVar6 = puVar2[1];
          puVar1 = (undefined8 *)((long)&(pvVar3[uVar10].items)->field_0 + lVar7);
          *puVar1 = *puVar2;
          puVar1[1] = uVar6;
          lVar7 = lVar7 + 0x10;
        }
        alignedFree(pVVar4);
        pvVar3[uVar10].size_active = sVar13;
        pvVar3[uVar10].size_alloced = uVar12;
      }
      sVar14 = pt.second.size_active;
      lVar7 = 0;
      for (uVar9 = 0; uVar9 < sVar13; uVar9 = uVar9 + 1) {
        puVar1 = (undefined8 *)((long)&(pt.first.items)->field_0 + lVar7);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pvVar3[uVar10].items)->field_0 + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        sVar13 = pvVar3[uVar10].size_active;
        lVar7 = lVar7 + 0x10;
      }
      pvVar3 = (this->tangents).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = pvVar3[uVar10].size_alloced;
      uVar12 = uVar9;
      if ((uVar9 < pt.second.size_active) &&
         (uVar11 = uVar9, uVar12 = pt.second.size_active, uVar9 != 0)) {
        for (; uVar12 = uVar11, uVar11 < pt.second.size_active;
            uVar11 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0)) {
        }
      }
      if (pt.second.size_active < pvVar3[uVar10].size_active) {
        pvVar3[uVar10].size_active = pt.second.size_active;
      }
      if (uVar9 == uVar12) {
        pvVar3[uVar10].size_active = pt.second.size_active;
      }
      else {
        pVVar4 = pvVar3[uVar10].items;
        pVVar8 = (Vec3fx *)alignedMalloc(uVar12 << 4,0x10);
        pvVar3[uVar10].items = pVVar8;
        lVar7 = 0;
        for (uVar9 = 0; uVar9 < pvVar3[uVar10].size_active; uVar9 = uVar9 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
          uVar6 = puVar2[1];
          puVar1 = (undefined8 *)((long)&(pvVar3[uVar10].items)->field_0 + lVar7);
          *puVar1 = *puVar2;
          puVar1[1] = uVar6;
          lVar7 = lVar7 + 0x10;
        }
        alignedFree(pVVar4);
        pvVar3[uVar10].size_active = sVar14;
        pvVar3[uVar10].size_alloced = uVar12;
      }
      lVar7 = 0;
      for (uVar9 = 0; uVar9 < sVar14; uVar9 = uVar9 + 1) {
        puVar1 = (undefined8 *)((long)&(pt.second.items)->field_0 + lVar7);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pvVar3[uVar10].items)->field_0 + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        sVar14 = pvVar3[uVar10].size_active;
        lVar7 = lVar7 + 0x10;
      }
      std::
      pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
      ::~pair(&pt);
      uVar10 = uVar10 + 1;
    }
    uVar10 = 0;
    for (uVar9 = 0;
        pHVar5 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(this->hairs).
                              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar5 >> 3);
        uVar9 = uVar9 + 1) {
      *(ulong *)(&pHVar5->vertex + uVar10) = uVar10 & 0xffffffff;
      uVar10 = uVar10 + 2;
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_hermite()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    tangents.resize(numTimeSteps());
    for (size_t i=0; i<positions.size(); i++) {
      auto pt = bezier_to_hermite_helper(hairs,positions[i]);
      positions[i] = pt.first;
      tangents[i] = pt.second;
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(2*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }